

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x354);
    pLVar3 = LogMessage::operator<<(&local_48,"CHECK failed: extension != nullptr: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_49,pLVar3);
    LogMessage::~LogMessage(&local_48);
  }
  if (pEVar2->is_repeated == false) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x355);
    pLVar3 = LogMessage::operator<<(&local_48,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_49,pLVar3);
    LogMessage::~LogMessage(&local_48);
  }
  CVar1 = anon_unknown_26::cpp_type(pEVar2->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    RepeatedField<int>::RemoveLast((pEVar2->field_0).repeated_int32_t_value);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::RemoveLast((pEVar2->field_0).repeated_int64_t_value);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::RemoveLast((pEVar2->field_0).repeated_uint32_t_value);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::RemoveLast((pEVar2->field_0).repeated_uint64_t_value);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::RemoveLast((pEVar2->field_0).repeated_double_value);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::RemoveLast((pEVar2->field_0).repeated_float_value);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::RemoveLast((pEVar2->field_0).repeated_bool_value);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar2->field_0).string_value);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar2->field_0).string_value);
  }
  return;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}